

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_gen_impl.h
# Opt level: O2

void secp256k1_ecmult_gen(secp256k1_ecmult_gen_context *ctx,secp256k1_gej *r,secp256k1_scalar *gn)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  uint flag;
  ulong uVar4;
  secp256k1_fe_storage *a;
  secp256k1_gej *psVar5;
  secp256k1_gej *psVar6;
  secp256k1_scalar local_ec;
  secp256k1_ge add;
  secp256k1_ge_storage adds;
  
  adds.x.n[0] = 0;
  adds.x.n[1] = 0;
  adds.x.n[2] = 0;
  adds.x.n[3] = 0;
  adds.x.n[4] = 0;
  adds.x.n[5] = 0;
  adds.x.n[6] = 0;
  adds.x.n[7] = 0;
  adds.y.n[0] = 0;
  adds.y.n[1] = 0;
  adds.y.n[2] = 0;
  adds.y.n[3] = 0;
  adds.y.n[4] = 0;
  adds.y.n[5] = 0;
  adds.y.n[6] = 0;
  adds.y.n[7] = 0;
  psVar5 = &ctx->initial;
  psVar6 = r;
  for (lVar2 = 0x1f; lVar2 != 0; lVar2 = lVar2 + -1) {
    (psVar6->x).n[0] = (psVar5->x).n[0];
    psVar5 = (secp256k1_gej *)((psVar5->x).n + 1);
    psVar6 = (secp256k1_gej *)((psVar6->x).n + 1);
  }
  secp256k1_scalar_add(&local_ec,gn,&ctx->blind);
  add.infinity = 0;
  lVar2 = 0x20;
  for (uVar3 = 0; uVar3 != 0x40; uVar3 = uVar3 + 1) {
    uVar1 = add.x.n[(uVar3 >> 3 & 0x1fffffff) - 8];
    a = (secp256k1_fe_storage *)((long)(*ctx->prec)[0][0].x.n + lVar2);
    for (uVar4 = 0; uVar4 != 0x10; uVar4 = uVar4 + 1) {
      flag = (uint)((uVar1 >> ((char)uVar3 * '\x04' & 0x1fU) & 0xf) == uVar4);
      secp256k1_fe_storage_cmov(&adds.x,a + -1,flag);
      secp256k1_fe_storage_cmov(&adds.y,a,flag);
      a = a + 2;
    }
    secp256k1_ge_from_storage(&add,&adds);
    secp256k1_gej_add_ge(r,r,&add);
    lVar2 = lVar2 + 0x400;
  }
  secp256k1_ge_clear(&add);
  return;
}

Assistant:

static void secp256k1_ecmult_gen(const secp256k1_ecmult_gen_context *ctx, secp256k1_gej *r, const secp256k1_scalar *gn) {
    secp256k1_ge add;
    secp256k1_ge_storage adds;
    secp256k1_scalar gnb;
    int bits;
    int i, j;
    memset(&adds, 0, sizeof(adds));
    *r = ctx->initial;
    /* Blind scalar/point multiplication by computing (n-b)G + bG instead of nG. */
    secp256k1_scalar_add(&gnb, gn, &ctx->blind);
    add.infinity = 0;
    for (j = 0; j < 64; j++) {
        bits = secp256k1_scalar_get_bits(&gnb, j * 4, 4);
        for (i = 0; i < 16; i++) {
            /** This uses a conditional move to avoid any secret data in array indexes.
             *   _Any_ use of secret indexes has been demonstrated to result in timing
             *   sidechannels, even when the cache-line access patterns are uniform.
             *  See also:
             *   "A word of warning", CHES 2013 Rump Session, by Daniel J. Bernstein and Peter Schwabe
             *    (https://cryptojedi.org/peter/data/chesrump-20130822.pdf) and
             *   "Cache Attacks and Countermeasures: the Case of AES", RSA 2006,
             *    by Dag Arne Osvik, Adi Shamir, and Eran Tromer
             *    (http://www.tau.ac.il/~tromer/papers/cache.pdf)
             */
            secp256k1_ge_storage_cmov(&adds, &(*ctx->prec)[j][i], i == bits);
        }
        secp256k1_ge_from_storage(&add, &adds);
        secp256k1_gej_add_ge(r, r, &add);
    }
    bits = 0;
    secp256k1_ge_clear(&add);
    secp256k1_scalar_clear(&gnb);
}